

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  uint uVar1;
  DenseIndex DVar2;
  double *pdVar3;
  Index size;
  ulong uVar4;
  undefined8 *puVar5;
  Index index;
  ulong uVar6;
  ulong uVar7;
  char *__function;
  Index size_2;
  long lVar8;
  double dVar9;
  VectorXd z_pred;
  MatrixXd Tc;
  MatrixXd S;
  DenseStorage<double,__1,__1,_1,_0> local_e0;
  DenseStorage<double,__1,__1,__1,_0> local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  MeasurementPackage local_a0;
  long local_80;
  long local_78;
  undefined8 local_70;
  double local_68;
  MeasurementPackage local_60;
  MeasurementPackage local_40;
  
  if (this->is_initialized_ == false) {
    local_a0.sensor_type_ = meas_package->sensor_type_;
    local_a0.timestamp_ = meas_package->timestamp_;
    DVar2 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_a0.raw_measurements_,DVar2,DVar2,1);
    uVar7 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)uVar7 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != uVar7) {
      free(local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data);
      if (uVar7 == 0) {
        local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data = (double *)0x0;
      }
      else if ((uVar7 >> 0x3d != 0) ||
              (local_a0.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                    (double *)malloc(uVar7 * 8),
              local_a0.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
              (double *)0x0)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = uVar7;
    if (uVar7 == (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar4 = uVar7 & 0x7ffffffffffffffe;
      if (1 < (long)uVar7) {
        uVar6 = 0;
        do {
          pdVar3 = (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   uVar6;
          dVar9 = pdVar3[1];
          local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data[uVar6] = *pdVar3;
          (local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data + uVar6)[1] = dVar9;
          uVar6 = uVar6 + 2;
        } while (uVar6 < uVar4);
      }
      if ((long)uVar4 < (long)uVar7) {
        pdVar3 = (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        do {
          local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data[uVar4] = pdVar3[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
      }
      SetInitialValues(this,&local_a0);
      free(local_a0.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data);
      this->previous_timestamp_ = meas_package->timestamp_;
      this->is_initialized_ = true;
      return;
    }
LAB_0010419c:
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  dVar9 = (double)(meas_package->timestamp_ - this->previous_timestamp_) / 1000000.0;
  while (0.1 < dVar9) {
    local_68 = dVar9;
    Prediction(this,0.05);
    dVar9 = local_68 + -0.05;
  }
  Prediction(this,dVar9);
  if (meas_package->sensor_type_ == LASER) {
    if (this->use_laser_ != true) {
      return;
    }
    uVar1 = this->n_zlas_;
    lVar8 = (long)(int)uVar1;
    if (lVar8 < 0) goto LAB_001041f1;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_e0,lVar8,lVar8,1);
    if (local_e0.m_rows != lVar8) {
      free(local_e0.m_data);
      if (uVar1 == 0) {
        local_e0.m_data = (double *)0x0;
      }
      else {
        local_e0.m_data = (double *)malloc(lVar8 * 8);
        if (local_e0.m_data == (double *)0x0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = operator_delete;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
    }
    if (1 < (int)uVar1) {
      uVar7 = 0;
      do {
        local_e0.m_data[uVar7] = 0.0;
        (local_e0.m_data + uVar7)[1] = 0.0;
        uVar7 = uVar7 + 2;
      } while (uVar7 < (uVar1 & 0x7ffffffe));
    }
    local_e0.m_rows = lVar8;
    if ((long)(ulong)(uVar1 & 0x7ffffffe) < lVar8) {
      memset(local_e0.m_data + (ulong)(uVar1 >> 1) * 2,0,lVar8 * 8 + (ulong)(uVar1 >> 1) * -0x10);
    }
    local_d0.m_data = (double *)(long)this->n_zlas_;
    local_d0.m_cols = 0;
    local_d0.m_rows = (DenseIndex)local_d0.m_data;
    if (-1 < (long)local_d0.m_data) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_b8,(long)local_d0.m_data * (long)local_d0.m_data,(DenseIndex)local_d0.m_data
                 ,(DenseIndex)local_d0.m_data);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_d0);
      local_80 = (long)this->n_x_;
      local_78 = (long)this->n_zlas_;
      local_70 = 0;
      if (-1 < (this->n_zlas_ | this->n_x_)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_d0,local_78 * local_80,local_80,local_78);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d0,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_80);
        PredictLidarMeasurement
                  (this,(VectorXd *)&local_e0,(MatrixXd *)&local_b8,(MatrixXd *)&local_d0);
        local_60.sensor_type_ = meas_package->sensor_type_;
        local_60.timestamp_ = meas_package->timestamp_;
        DVar2 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_60.raw_measurements_,DVar2,DVar2,1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_60.raw_measurements_.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        if (local_60.raw_measurements_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          uVar7 = local_60.raw_measurements_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
                  (local_60.raw_measurements_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  >> 0x3f) & 0xfffffffffffffffe;
          if (1 < local_60.raw_measurements_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            lVar8 = 0;
            do {
              pdVar3 = (meas_package->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + lVar8;
              dVar9 = pdVar3[1];
              local_60.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar8]
                   = *pdVar3;
              (local_60.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
              lVar8)[1] = dVar9;
              lVar8 = lVar8 + 2;
            } while (lVar8 < (long)uVar7);
          }
          if ((long)uVar7 <
              local_60.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            pdVar3 = (meas_package->raw_measurements_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            do {
              local_60.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar7]
                   = pdVar3[uVar7];
              uVar7 = uVar7 + 1;
            } while (local_60.raw_measurements_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                     != uVar7);
          }
          UpdateLidar(this,&local_60,(VectorXd *)&local_e0,(MatrixXd *)&local_d0,
                      (MatrixXd *)&local_b8);
          local_40.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data =
               local_60.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          goto LAB_00104163;
        }
        goto LAB_0010419c;
      }
    }
  }
  else {
    if (meas_package->sensor_type_ != RADAR) {
      return;
    }
    if (this->use_radar_ != true) {
      return;
    }
    uVar1 = this->n_zrad_;
    lVar8 = (long)(int)uVar1;
    if (lVar8 < 0) {
LAB_001041f1:
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00104206;
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_e0,lVar8,lVar8,1);
    if (local_e0.m_rows != lVar8) {
      free(local_e0.m_data);
      if (uVar1 == 0) {
        local_e0.m_data = (double *)0x0;
      }
      else {
        local_e0.m_data = (double *)malloc(lVar8 * 8);
        if (local_e0.m_data == (double *)0x0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = operator_delete;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
    }
    if (1 < (int)uVar1) {
      uVar7 = 0;
      do {
        local_e0.m_data[uVar7] = 0.0;
        (local_e0.m_data + uVar7)[1] = 0.0;
        uVar7 = uVar7 + 2;
      } while (uVar7 < (uVar1 & 0x7ffffffe));
    }
    local_e0.m_rows = lVar8;
    if ((long)(ulong)(uVar1 & 0x7ffffffe) < lVar8) {
      memset(local_e0.m_data + (ulong)(uVar1 >> 1) * 2,0,lVar8 * 8 + (ulong)(uVar1 >> 1) * -0x10);
    }
    local_d0.m_data = (double *)(long)this->n_zrad_;
    local_d0.m_cols = 0;
    local_d0.m_rows = (DenseIndex)local_d0.m_data;
    if (-1 < (long)local_d0.m_data) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_b8,(long)local_d0.m_data * (long)local_d0.m_data,(DenseIndex)local_d0.m_data
                 ,(DenseIndex)local_d0.m_data);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_d0);
      local_80 = (long)this->n_x_;
      local_78 = (long)this->n_zrad_;
      local_70 = 0;
      if (-1 < (this->n_zrad_ | this->n_x_)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_d0,local_78 * local_80,local_80,local_78);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d0,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_80);
        PredictRadarMeasurement
                  (this,(VectorXd *)&local_e0,(MatrixXd *)&local_b8,(MatrixXd *)&local_d0);
        local_40.sensor_type_ = meas_package->sensor_type_;
        local_40.timestamp_ = meas_package->timestamp_;
        DVar2 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_40.raw_measurements_,DVar2,DVar2,1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_40.raw_measurements_.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        if (local_40.raw_measurements_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          uVar7 = local_40.raw_measurements_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
                  (local_40.raw_measurements_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  >> 0x3f) & 0xfffffffffffffffe;
          if (1 < local_40.raw_measurements_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            lVar8 = 0;
            do {
              pdVar3 = (meas_package->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + lVar8;
              dVar9 = pdVar3[1];
              local_40.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar8]
                   = *pdVar3;
              (local_40.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
              lVar8)[1] = dVar9;
              lVar8 = lVar8 + 2;
            } while (lVar8 < (long)uVar7);
          }
          if ((long)uVar7 <
              local_40.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            pdVar3 = (meas_package->raw_measurements_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            do {
              local_40.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar7]
                   = pdVar3[uVar7];
              uVar7 = uVar7 + 1;
            } while (local_40.raw_measurements_.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                     != uVar7);
          }
          UpdateRadar(this,&local_40,(VectorXd *)&local_e0,(MatrixXd *)&local_d0,
                      (MatrixXd *)&local_b8);
LAB_00104163:
          free(local_40.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
          this->previous_timestamp_ = meas_package->timestamp_;
          free(local_d0.m_data);
          free(local_b8.m_data);
          free(local_e0.m_data);
          return;
        }
        goto LAB_0010419c;
      }
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104206:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,__function);
}

Assistant:

void UKF::ProcessMeasurement(const MeasurementPackage meas_package) {
  
  if (!is_initialized_) {

    //  Initialize the state x_,state covariance matrix P_
    SetInitialValues(meas_package);
    previous_timestamp_ = meas_package.timestamp_;
    is_initialized_ = true;

    return;
  }


  double delta_t =  (meas_package.timestamp_ - previous_timestamp_) / 1000000.0;
  while (delta_t > 0.1)
  {
//  cout<< "delta_t: " << delta_t << endl;
//  cout << "Press ENTER to continue...";
//  cin.ignore( std::numeric_limits<std::streamsize>::max(), '\n' );
  
  const double dt = 0.05;
  Prediction(dt);
  delta_t -= dt;
  }

  Prediction(delta_t);


  if ( meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_ ) {
    // Radar updates 
    // rho, phi, rho_dot

    //mean predicted measurement
    VectorXd z_pred = VectorXd::Zero(n_zrad_);
    //measurement covariance matrix S
    MatrixXd S = MatrixXd::Zero(n_zrad_,n_zrad_);
    // cross-correlation matrix Tc
    MatrixXd Tc = MatrixXd::Zero(n_x_, n_zrad_);
    // get predictions for x,S and Tc in RADAR space
    PredictRadarMeasurement(z_pred, S, Tc);  
    // update the state using the RADAR measurement
    UpdateRadar(meas_package, z_pred, Tc, S);
    // update the time
    previous_timestamp_ = meas_package.timestamp_;

  } 

  else if ( meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_ ) {
    // Laser updates
    // px, py

    //mean predicted measurement
    VectorXd z_pred = VectorXd::Zero(n_zlas_);
    //measurement covariance matrix S
    MatrixXd S = MatrixXd::Zero(n_zlas_,n_zlas_);
    // cross-correlation matrix Tc
    MatrixXd Tc = MatrixXd::Zero(n_x_, n_zlas_);
    // get predictions for x,S and Tc in Lidar space
    PredictLidarMeasurement(z_pred, S, Tc);
    // update the state using the LIDAR measurement
    UpdateLidar(meas_package, z_pred, Tc, S);
    // update the time
    previous_timestamp_ = meas_package.timestamp_;

  }

  return;

}